

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O1

void raviX_hash_table_destroy(HashTable *ht,_func_void_HashEntry_ptr *delete_function)

{
  HashEntry *pHVar1;
  long lVar2;
  HashEntry *pHVar3;
  HashEntry *pHVar4;
  
  if (ht == (HashTable *)0x0) {
    return;
  }
  if (delete_function != (_func_void_HashEntry_ptr *)0x0) {
    if ((ulong)ht->size != 0) {
      pHVar3 = ht->table;
      lVar2 = (ulong)ht->size * 0x18;
      do {
        if ((uint32_t *)pHVar3->key != (uint32_t *)0x0 &&
            (uint32_t *)pHVar3->key != &deleted_key_value) goto joined_r0x0010d248;
        pHVar3 = pHVar3 + 1;
        lVar2 = lVar2 + -0x18;
      } while (lVar2 != 0);
    }
    pHVar3 = (HashEntry *)0x0;
joined_r0x0010d248:
    if (pHVar3 != (HashEntry *)0x0) {
      (*delete_function)(pHVar3);
      pHVar4 = pHVar3;
      do {
        pHVar3 = pHVar4 + 1;
        if (pHVar3 == ht->table + ht->size) {
          pHVar3 = (HashEntry *)0x0;
          break;
        }
        pHVar1 = pHVar4 + 1;
        pHVar4 = pHVar3;
      } while ((uint32_t *)pHVar1->key == (uint32_t *)0x0 ||
               (uint32_t *)pHVar1->key == &deleted_key_value);
      goto joined_r0x0010d248;
    }
  }
  raviX_free(ht->table);
  raviX_free(ht);
  return;
}

Assistant:

void
raviX_hash_table_destroy(HashTable *ht,
		   void (*delete_function)(HashEntry *entry))
{
	if (!ht)
		return;

	if (delete_function) {
		HashEntry *entry;

		hash_table_foreach(ht, entry) {
			delete_function(entry);
		}
	}
	raviX_free(ht->table);
	raviX_free(ht);
}